

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O0

void grd_free(grd_t *grd)

{
  uint uVar1;
  undefined8 *in_RDI;
  uint32_t w;
  uint32_t W;
  uint local_10;
  
  uVar1 = *(uint *)(*(long *)*in_RDI + 0x5c);
  for (local_10 = 0; local_10 < uVar1; local_10 = local_10 + 1) {
    grd_stfree((grd_st_t *)0x10ccd3);
  }
  free((void *)in_RDI[1]);
  free(in_RDI);
  return;
}

Assistant:

void grd_free(grd_t *grd) {
	const uint32_t W = grd->mdl->opt->nthread;
#ifdef ATM_ANSI
	for (uint32_t w = 1; w < W; w++)
		xvm_free(grd->grd_st[w]->g);
#endif
	for (uint32_t w = 0; w < W; w++)
		grd_stfree(grd->grd_st[w]);
	free(grd->grd_st);
	free(grd);
}